

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.h
# Opt level: O2

void __thiscall IRBuilder::IRBuilder(IRBuilder *this,Func *func)

{
  uint uVar1;
  JITTimeFunctionBody *this_00;
  Opnd **ppOVar2;
  
  this->seenLdStackArgPtr = false;
  this->expectApplyArg = false;
  this->seenProfiledBeginSwitch = false;
  this->m_func = func;
  (this->m_statementReader).m_startLocation = (byte *)0x0;
  (this->m_statementReader).m_statementMap = (SmallSpanSequence *)0x0;
  (this->m_statementReader).m_statementMapIter.accumulatedIndex = -1;
  (this->m_statementReader).m_statementMapIter.accumulatedSourceBegin = 0;
  (this->m_statementReader).m_statementMapIter.accumulatedBytecodeBegin = 0;
  *(undefined8 *)&(this->m_statementReader).m_statementMapIter.indexOfActualOffset = 0;
  *(undefined8 *)((long)&(this->m_statementReader).m_fullstatementMap + 4) = 0;
  *(undefined8 *)((long)&(this->m_statementReader).m_nextStatementBoundary + 4) = 0;
  (this->m_statementReader).m_startOfStatement = true;
  this->handlerOffsetStack =
       (SList<JsUtil::Pair<unsigned_int,_bool,_DefaultComparer>,_Memory::ArenaAllocator,_RealCount>
        *)0x0;
  (this->m_switchAdapter).super_SwitchAdapter._vptr_SwitchAdapter =
       (_func_int **)&PTR_AddBranchInstr_01375370;
  (this->m_switchAdapter).m_builder = this;
  (this->m_switchBuilder).m_adapter = &(this->m_switchAdapter).super_SwitchAdapter;
  (this->m_switchBuilder).m_seenOnlySingleCharStrCaseNodes = true;
  (this->m_switchBuilder).m_profiledSwitchInstr = (Instr *)0x0;
  (this->m_switchBuilder).m_isAsmJs = false;
  (this->m_switchBuilder).m_switchOptBuildBail = false;
  (this->m_switchBuilder).m_switchIntDynProfile = false;
  (this->m_switchBuilder).m_switchStrDynProfile = false;
  this->m_ldSlots = (BVFixed *)0x0;
  this->finallyBlockLevel = 0;
  this->m_callsOnStack = 0;
  this->m_argsOnStack = 0;
  this->m_loopCounterSym = (StackSym *)0x0;
  this->m_stackFuncPtrSym = (StackSym *)0x0;
  this->m_usedAsTemp = (BVFixed *)0x0;
  this->m_loopBodyRetIPSym = (StackSym *)0x0;
  this->m_paramScopeDone = false;
  this->callTreeHasSomeProfileInfo = false;
  this->m_saveLoopImplicitCallFlags = (Opnd **)0x0;
  this->m_loopBodyForInEnumeratorArrayOpnd = (RegOpnd *)0x0;
  this->longBranchMap = (LongBranchMap *)0x0;
  GeneratorJumpTable::GeneratorJumpTable(&this->m_generatorJumpTable,func,this);
  this_00 = Func::GetJITFunctionBody(func);
  uVar1 = JITTimeFunctionBody::GetLoopCount(this_00);
  if (uVar1 != 0) {
    ppOVar2 = Memory::AllocateArray<Memory::ArenaAllocator,IR::Opnd*,false>
                        ((Memory *)func->m_alloc,(ArenaAllocator *)Memory::ArenaAllocator::AllocZero
                         ,0,(ulong)uVar1);
    this->m_saveLoopImplicitCallFlags = ppOVar2;
  }
  JITTimeWorkItem::InitializeReader
            (func->m_workItem,&this->m_jnReader,&this->m_statementReader,
             &func->m_alloc->super_ArenaAllocator);
  return;
}

Assistant:

IRBuilder(Func * func)
        : m_func(func)
        , m_argsOnStack(0)
        , m_loopBodyRetIPSym(nullptr)
        , m_ldSlots(nullptr)
        , m_loopCounterSym(nullptr)
        , callTreeHasSomeProfileInfo(false)
        , finallyBlockLevel(0)
        , m_saveLoopImplicitCallFlags(nullptr)
        , handlerOffsetStack(nullptr)
        , m_switchAdapter(this)
        , m_switchBuilder(&m_switchAdapter)
        , m_stackFuncPtrSym(nullptr)
        , m_loopBodyForInEnumeratorArrayOpnd(nullptr)
        , m_paramScopeDone(false)
#if DBG
        , m_callsOnStack(0)
        , m_usedAsTemp(nullptr)
#endif
#ifdef BAILOUT_INJECTION
        , seenLdStackArgPtr(false)
        , expectApplyArg(false)
        , seenProfiledBeginSwitch(false)
#endif
#ifdef BYTECODE_BRANCH_ISLAND
        , longBranchMap(nullptr)
#endif
        , m_generatorJumpTable(GeneratorJumpTable(func, this))
    {
        auto loopCount = func->GetJITFunctionBody()->GetLoopCount();
        if (loopCount > 0) {
#if DBG
            m_saveLoopImplicitCallFlags = AnewArrayZ(func->m_alloc, IR::Opnd*, loopCount);
#else
            m_saveLoopImplicitCallFlags = AnewArray(func->m_alloc, IR::Opnd*, loopCount);
#endif
        }

        // Note: use original byte code without debugging probes, so that we don't jit BPs inserted by the user.
        func->m_workItem->InitializeReader(&m_jnReader, &m_statementReader, func->m_alloc);
    }